

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcFooting::~IfcFooting(IfcFooting *this)

{
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  plVar1 = (long *)(&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>).field_0x20
                   + lVar2);
  plVar1[-0x2d] = 0x879218;
  plVar1[2] = 0x879330;
  plVar1[-0x1c] = 0x879240;
  plVar1[-0x1a] = 0x879268;
  plVar1[-0x13] = 0x879290;
  plVar1[-0xd] = 0x8792b8;
  plVar1[-6] = 0x8792e0;
  plVar1[-4] = 0x879308;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcElement::~IfcElement
            ((IfcElement *)(&this->field_0x0 + lVar2),&PTR_construction_vtable_24__00879350);
  operator_delete((IfcElement *)(&this->field_0x0 + lVar2),400);
  return;
}

Assistant:

IfcFooting() : Object("IfcFooting") {}